

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O0

bool __thiscall APowerInvisibility::HandlePickup(APowerInvisibility *this,AInventory *item)

{
  bool bVar1;
  MetaClass *pMVar2;
  MetaClass *pMVar3;
  APowerup *power;
  AInventory *item_local;
  APowerInvisibility *this_local;
  
  bVar1 = FName::operator==(&(this->super_APowerup).Mode.super_FName,NAME_Cumulative);
  if ((bVar1) &&
     ((this->super_APowerup).Strength *
      (double)(this->super_APowerup).super_AInventory.super_AActor.special1 < 1.0)) {
    pMVar2 = AInventory::GetClass(item);
    pMVar3 = AInventory::GetClass((AInventory *)this);
    if (pMVar2 == pMVar3) {
      if (*(int *)&item->field_0x4fc == 0) {
        item->ItemFlags = item->ItemFlags | 4;
        return true;
      }
      if (*(int *)&(this->super_APowerup).super_AInventory.field_0x4fc < *(int *)&item->field_0x4fc)
      {
        *(undefined4 *)&(this->super_APowerup).super_AInventory.field_0x4fc =
             *(undefined4 *)&item->field_0x4fc;
        (this->super_APowerup).BlendColor.field_0 =
             *(anon_union_4_2_12391d7c_for_PalEntry_0 *)(item + 1);
      }
      (this->super_APowerup).super_AInventory.super_AActor.special1 =
           (this->super_APowerup).super_AInventory.super_AActor.special1 + 1;
      item->ItemFlags = item->ItemFlags | 4;
      return true;
    }
  }
  bVar1 = APowerup::HandlePickup(&this->super_APowerup,item);
  return bVar1;
}

Assistant:

bool APowerInvisibility::HandlePickup (AInventory *item)
{
	if (Mode == NAME_Cumulative && ((Strength * special1) < 1.) && item->GetClass() == GetClass())
	{
		APowerup *power = static_cast<APowerup *>(item);
		if (power->EffectTics == 0)
		{
			power->ItemFlags |= IF_PICKUPGOOD;
			return true;
		}
		// Only increase the EffectTics, not decrease it.
		// Color also gets transferred only when the new item has an effect.
		if (power->EffectTics > EffectTics)
		{
			EffectTics = power->EffectTics;
			BlendColor = power->BlendColor;
		}
		special1++;	// increases power
		power->ItemFlags |= IF_PICKUPGOOD;
		return true;
	}
	return Super::HandlePickup (item);
}